

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expr.hpp
# Opt level: O2

rt_vector_expr<viennamath::rt_expression_interface<double>_> *
viennamath::operator*
          (rt_vector_expr<viennamath::rt_expression_interface<double>_> *__return_storage_ptr__,
          rt_vector_expr<viennamath::rt_expression_interface<double>_> *lhs,
          rt_variable<viennamath::rt_expression_interface<double>_> *rhs)

{
  pointer prVar1;
  long lVar2;
  ulong uVar3;
  type local_50;
  
  rt_vector_expr<viennamath::rt_expression_interface<double>_>::rt_vector_expr
            (__return_storage_ptr__,
             (long)(lhs->
                   super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                   ).
                   super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(lhs->
                   super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                   ).
                   super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  lVar2 = 0;
  for (uVar3 = 0;
      prVar1 = (lhs->
               super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ).
               super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(lhs->
                            super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                            ).
                            super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)prVar1 >> 3);
      uVar3 = uVar3 + 1) {
    result_of::
    mult<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_viennamath::rt_variable<viennamath::rt_expression_interface<double>_>,_false,_false>
    ::instance(&local_50,
               (rt_expr<viennamath::rt_expression_interface<double>_> *)
               ((long)&(prVar1->rt_expr_)._M_ptr + lVar2),rhs);
    rt_expr<viennamath::rt_expression_interface<double>_>::operator=
              ((rt_expr<viennamath::rt_expression_interface<double>_> *)
               ((long)&(((__return_storage_ptr__->
                         super_vector<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         ).
                         super__Vector_base<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>,_std::allocator<viennamath::rt_expr<viennamath::rt_expression_interface<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->rt_expr_)._M_ptr + lVar2),
               &local_50);
    rt_binary_expr<viennamath::rt_expression_interface<double>_>::~rt_binary_expr(&local_50);
    lVar2 = lVar2 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

rt_vector_expr<InterfaceType> operator*(rt_vector_expr<InterfaceType> const & lhs, T const & rhs)
  {
    rt_vector_expr<InterfaceType> result(lhs.size());
    for (std::size_t i=0; i<lhs.size(); ++i)
      result[i] = lhs[i] * rhs;

    return result;
  }